

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dynamic_groups.c
# Opt level: O2

int main(void)

{
  long lVar1;
  tommy_list ptVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int i;
  uint uVar6;
  uint uVar7;
  char *__assertion;
  long in_FS_OFFSET;
  rtr_mgr_group group5;
  rtr_socket rtr_tcp5;
  tr_socket tr_tcp5;
  rtr_mgr_group group4;
  rtr_socket rtr_tcp4;
  tr_socket tr_tcp4;
  rtr_mgr_group group3;
  rtr_socket rtr_tcp3;
  tr_socket tr_tcp3;
  rtr_mgr_config *conf;
  rtr_mgr_group group2;
  rtr_socket rtr_tcp2;
  tr_socket tr_tcp2;
  rtr_socket rtr_tcp;
  tr_tcp_config local_f8;
  tr_socket tr_tcp;
  char tcp_port [5];
  rtr_mgr_group groups [1];
  char tcp_host [33];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.host = tcp_host;
  builtin_strncpy(tcp_host + 0x10,"cs.tu-dresden.de",0x11);
  builtin_strncpy(tcp_host,"rpki-cache.netd.",0x10);
  uVar7 = 0;
  local_f8.port = tcp_port;
  builtin_strncpy(tcp_port,"3323",5);
  local_f8.bindaddr = (char *)0x0;
  local_f8.data._0_4_ = 0;
  local_f8.data._4_4_ = 0;
  local_f8.new_socket._0_4_ = 0;
  local_f8._36_8_ = 0;
  tr_tcp_init(&local_f8,&tr_tcp);
  rtr_tcp.tr_socket = &tr_tcp;
  groups[0].sockets = (rtr_socket **)malloc(8);
  uVar6 = 1;
  *groups[0].sockets = &rtr_tcp;
  groups[0].preference = '\x01';
  groups[0].sockets_len = uVar6;
  tr_tcp_init(&local_f8,&tr_tcp2);
  rtr_tcp2.tr_socket = &tr_tcp2;
  group2.sockets = (rtr_socket **)malloc(8);
  *group2.sockets = &rtr_tcp2;
  group2.preference = '\x02';
  group2.sockets_len = uVar6;
  rtr_mgr_init(&conf,groups,1,connection_status_callback,(void *)0x0);
  rtr_mgr_add_roa_support(conf,(pfx_update_fp)0x0);
  rtr_mgr_add_aspa_support(conf,(aspa_update_fp)0x0);
  rtr_mgr_add_spki_support(conf,(spki_update_fp)0x0);
  rtr_mgr_setup_sockets(conf,groups,1,0x32,600,600);
  rtr_mgr_start(conf);
  while( true ) {
    _Var3 = rtr_mgr_conf_in_sync(conf);
    if (_Var3) break;
    if ((connection_status == RTR_MGR_ERROR) || (0x4f < uVar7)) goto LAB_00105955;
    uVar7 = uVar7 + 1;
    sleep(1);
  }
  if (conf->len == 1) {
    iVar4 = rtr_mgr_add_group(conf,&group2);
    if (iVar4 == 0) {
      iVar4 = rtr_mgr_add_group(conf,&group2);
      if (iVar4 == -2) {
        ptVar2 = conf->groups->list;
        if (*(char *)(*(long *)((long)ptVar2->data + 0x20) + 0xc) == '\x01') {
          if (*(char *)(*(long *)((long)ptVar2->next->data + 0x20) + 0xc) == '\x02') {
            if (conf->len == 2) {
              rtr_mgr_remove_group(conf,1);
              if (*(char *)(*(long *)((long)conf->groups->list->data + 0x20) + 0xc) == '\x02') {
                if (conf->len == 1) {
                  tr_tcp_init(&local_f8,&tr_tcp3);
                  rtr_tcp3.tr_socket = &tr_tcp3;
                  group3.sockets = (rtr_socket **)malloc(8);
                  *group3.sockets = &rtr_tcp3;
                  group3.preference = '\x03';
                  group3.sockets_len = 1;
                  tr_tcp_init(&local_f8,&tr_tcp4);
                  rtr_tcp4.tr_socket = &tr_tcp4;
                  group4.sockets = (rtr_socket **)malloc(8);
                  *group4.sockets = &rtr_tcp4;
                  group4.preference = '\x04';
                  group4.sockets_len = 1;
                  rtr_mgr_add_group(conf,&group4);
                  rtr_mgr_remove_group(conf,2);
                  rtr_mgr_add_group(conf,&group3);
                  if (*(char *)(*(long *)((long)conf->groups->list->data + 0x20) + 0xc) != '\x03') {
                    __assert_fail("group_node->group->preference == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                                  ,0x8e,"int main(void)");
                  }
                  iVar4 = rtr_mgr_remove_group(conf,10);
                  if (iVar4 != -1) {
                    __assert_fail("retval == RTR_ERROR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                                  ,0x92,"int main(void)");
                  }
                  tr_tcp_init(&local_f8,&tr_tcp5);
                  rtr_tcp5.tr_socket = &tr_tcp5;
                  group5.sockets = (rtr_socket **)malloc(8);
                  group5.sockets_len = 1;
                  *group5.sockets = &rtr_tcp5;
                  group5.preference = '\x05';
                  iVar4 = 0x65;
                  while (iVar4 = iVar4 + -1, iVar4 != 0) {
                    iVar5 = rtr_mgr_add_group(conf,&group5);
                    group5.preference = group5.preference + '\x01';
                    if (iVar5 != 0) {
                      __assert_fail("retval == RTR_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                                    ,0xa3,"int main(void)");
                    }
                  }
                  uVar6 = 0x68;
                  while( true ) {
                    if (uVar6 < 5) break;
                    iVar4 = rtr_mgr_remove_group(conf,uVar6);
                    uVar6 = uVar6 - 1;
                    if (iVar4 != 0) {
                      __assert_fail("retval == RTR_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                                    ,0xa9,"int main(void)");
                    }
                  }
                  rtr_mgr_remove_group(conf,4);
                  iVar4 = rtr_mgr_remove_group(conf,3);
                  if (iVar4 != -1) {
                    __assert_fail("retval == RTR_ERROR",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                                  ,0xb0,"int main(void)");
                  }
                  rtr_mgr_stop(conf);
                  rtr_mgr_free(conf);
                  free(groups[0].sockets);
                  free(group2.sockets);
                  free(group3.sockets);
                  free(group4.sockets);
                  free(group5.sockets);
                  uVar6 = 0;
LAB_00105955:
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                    return uVar6;
                  }
                  __stack_chk_fail();
                }
                __assertion = "conf->len == 1";
                uVar6 = 0x6b;
              }
              else {
                __assertion = "group_node->group->preference == 2";
                uVar6 = 0x6a;
              }
            }
            else {
              __assertion = "conf->len == 2";
              uVar6 = 100;
            }
          }
          else {
            __assertion = "group_node2->group->preference == 2";
            uVar6 = 99;
          }
        }
        else {
          __assertion = "group_node->group->preference == 1";
          uVar6 = 0x62;
        }
      }
      else {
        __assertion = "retval == RTR_INVALID_PARAM";
        uVar6 = 0x5c;
      }
    }
    else {
      __assertion = "retval == RTR_SUCCESS";
      uVar6 = 0x57;
    }
  }
  else {
    __assertion = "conf->len == 1";
    uVar6 = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                ,uVar6,"int main(void)");
}

Assistant:

int main(void)
{
	int retval = 0;
	char tcp_host[] = "rpki-cache.netd.cs.tu-dresden.de";
	char tcp_port[] = "3323";

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {
		tcp_host, //IP
		tcp_port, //Port
		NULL, //Source address
		NULL, //data
		NULL, //new_socket()
		0, // connect timeout
	};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mr_group array with 1 element */
	groups[0].sockets = malloc(sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct tr_socket tr_tcp2;
	struct rtr_socket rtr_tcp2;
	struct rtr_mgr_group group2;

	tr_tcp_init(&tcp_config, &tr_tcp2);
	rtr_tcp2.tr_socket = &tr_tcp2;
	group2.sockets = malloc(sizeof(struct rtr_socket *));
	group2.sockets_len = 1;
	group2.sockets[0] = &rtr_tcp2;
	group2.preference = 2;

	struct rtr_mgr_config *conf;

	rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL);
	rtr_mgr_add_roa_support(conf, NULL);
	rtr_mgr_add_aspa_support(conf, NULL);
	rtr_mgr_add_spki_support(conf, NULL);
	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	//start the connection manager
	rtr_mgr_start(conf);

	int sleep_counter = 0;
	// wait 20 sec till at least one group is fully synchronized with the server
	// otherwise EXIT_FAILURE.
	while (!rtr_mgr_conf_in_sync(conf)) {
		sleep_counter++;
		if (connection_status == RTR_MGR_ERROR || sleep_counter > connection_timeout)
			return EXIT_FAILURE;

		sleep(1);
	}

	assert(conf->len == 1);

	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_SUCCESS);

	//checking behavior in case the group preference already exists
	//by adding the same group twice.
	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_INVALID_PARAM);

	tommy_node *node = tommy_list_head(&conf->groups->list);
	struct rtr_mgr_group_node *group_node = node->data;
	struct rtr_mgr_group_node *group_node2 = node->next->data;

	assert(group_node->group->preference == 1);
	assert(group_node2->group->preference == 2);
	assert(conf->len == 2);

	rtr_mgr_remove_group(conf, 1);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 2);
	assert(conf->len == 1);

	struct tr_socket tr_tcp3;
	struct rtr_socket rtr_tcp3;
	struct rtr_mgr_group group3;

	tr_tcp_init(&tcp_config, &tr_tcp3);
	rtr_tcp3.tr_socket = &tr_tcp3;
	group3.sockets = malloc(sizeof(struct rtr_socket *));
	group3.sockets_len = 1;
	group3.sockets[0] = &rtr_tcp3;
	group3.preference = 3;

	struct tr_socket tr_tcp4;
	struct rtr_socket rtr_tcp4;
	struct rtr_mgr_group group4;

	tr_tcp_init(&tcp_config, &tr_tcp4);
	rtr_tcp4.tr_socket = &tr_tcp4;
	group4.sockets = malloc(sizeof(struct rtr_socket *));
	group4.sockets_len = 1;
	group4.sockets[0] = &rtr_tcp4;
	group4.preference = 4;

	rtr_mgr_add_group(conf, &group4);

	// remove group 2 so group 4 becomes the active group.
	rtr_mgr_remove_group(conf, 2);

	// add group 3 which has a higher preference than group 4
	// and check whether it will be set as the active group.
	rtr_mgr_add_group(conf, &group3);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 3);

	//try to remove non-existent group
	retval = rtr_mgr_remove_group(conf, 10);
	assert(retval == RTR_ERROR);

	struct tr_socket tr_tcp5;
	struct rtr_socket rtr_tcp5;
	struct rtr_mgr_group group5;

	tr_tcp_init(&tcp_config, &tr_tcp5);
	rtr_tcp5.tr_socket = &tr_tcp5;
	group5.sockets = malloc(sizeof(struct rtr_socket *));
	group5.sockets_len = 1;
	group5.sockets[0] = &rtr_tcp5;
	group5.preference = 5;

	//add 100 groups
	for (int i = 0; i < 100; i++) {
		retval = rtr_mgr_add_group(conf, &group5);
		group5.preference++;
		assert(retval == RTR_SUCCESS);
	}

	//remove 100 groups
	for (int i = 104; i >= 5; i--) {
		retval = rtr_mgr_remove_group(conf, i);
		assert(retval == RTR_SUCCESS);
	}

	rtr_mgr_remove_group(conf, 4);

	//try to remove last remainig group.
	retval = rtr_mgr_remove_group(conf, 3);
	assert(retval == RTR_ERROR);
	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);
	free(group2.sockets);
	free(group3.sockets);
	free(group4.sockets);
	free(group5.sockets);
}